

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

bool IsProxy(CNetAddr *addr)

{
  bool bVar1;
  ulong uVar2;
  Proxy *other;
  long in_FS_OFFSET;
  bool bVar3;
  UniqueLock<GlobalMutex> criticalblock10;
  unique_lock<std::mutex> local_68;
  direct_or_indirect local_58;
  uint local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_device = (mutex_type *)&g_proxyinfo_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_68);
  bVar3 = true;
  other = proxyInfo;
  uVar2 = 0;
  do {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)other);
    local_40._0_4_ = (other->proxy).super_CNetAddr.m_net;
    local_40._4_4_ = (other->proxy).super_CNetAddr.m_scope_id;
    bVar1 = operator==(addr,(CNetAddr *)&local_58.indirect_contents);
    if (0x10 < local_48) {
      free(local_58.indirect_contents.indirect);
      local_58.indirect_contents.indirect = (char *)0x0;
    }
    if (bVar1) break;
    bVar3 = uVar2 < 6;
    uVar2 = uVar2 + 1;
    other = other + 1;
  } while (uVar2 != 7);
  std::unique_lock<std::mutex>::~unique_lock(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool IsProxy(const CNetAddr &addr) {
    LOCK(g_proxyinfo_mutex);
    for (int i = 0; i < NET_MAX; i++) {
        if (addr == static_cast<CNetAddr>(proxyInfo[i].proxy))
            return true;
    }
    return false;
}